

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::SelectGenericLoopSelSwitch<long,long,duckdb::Equals,false>
                (long *ldata,long *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  idx_t iVar6;
  idx_t iVar7;
  long lVar8;
  SelectionVector *pSVar9;
  idx_t iVar10;
  idx_t iVar11;
  idx_t iVar12;
  idx_t iVar13;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        lVar8 = 0;
      }
      else {
        psVar1 = result_sel->sel_vector;
        psVar2 = lsel->sel_vector;
        psVar3 = rsel->sel_vector;
        puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        puVar5 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        lVar8 = 0;
        iVar7 = 0;
        do {
          iVar12 = iVar7;
          if (psVar1 != (sel_t *)0x0) {
            iVar12 = (idx_t)psVar1[iVar7];
          }
          iVar13 = iVar7;
          if (psVar2 != (sel_t *)0x0) {
            iVar13 = (idx_t)psVar2[iVar7];
          }
          iVar11 = iVar7;
          if (psVar3 != (sel_t *)0x0) {
            iVar11 = (idx_t)psVar3[iVar7];
          }
          if ((((puVar4 != (unsigned_long *)0x0) &&
               ((puVar4[iVar13 >> 6] >> (iVar13 & 0x3f) & 1) == 0)) ||
              ((puVar5 != (unsigned_long *)0x0 &&
               ((puVar5[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) == 0)))) ||
             (ldata[iVar13] != rdata[iVar11])) {
            false_sel->sel_vector[lVar8] = (sel_t)iVar12;
            lVar8 = lVar8 + 1;
          }
          iVar7 = iVar7 + 1;
        } while (count != iVar7);
      }
      return count - lVar8;
    }
    if (count != 0) {
      psVar1 = result_sel->sel_vector;
      psVar2 = lsel->sel_vector;
      psVar3 = rsel->sel_vector;
      puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      puVar5 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar7 = 0;
      iVar12 = 0;
      do {
        iVar13 = iVar12;
        if (psVar1 != (sel_t *)0x0) {
          iVar13 = (idx_t)psVar1[iVar12];
        }
        iVar11 = iVar12;
        if (psVar2 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar2[iVar12];
        }
        iVar6 = iVar12;
        if (psVar3 != (sel_t *)0x0) {
          iVar6 = (idx_t)psVar3[iVar12];
        }
        if ((((puVar4 == (unsigned_long *)0x0) ||
             ((puVar4[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) != 0)) &&
            ((puVar5 == (unsigned_long *)0x0 || ((puVar5[iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0))))
           && (ldata[iVar11] == rdata[iVar6])) {
          true_sel->sel_vector[iVar7] = (sel_t)iVar13;
          iVar7 = iVar7 + 1;
        }
        iVar12 = iVar12 + 1;
      } while (count != iVar12);
      return iVar7;
    }
  }
  else if (count != 0) {
    psVar1 = result_sel->sel_vector;
    psVar2 = lsel->sel_vector;
    psVar3 = rsel->sel_vector;
    puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar5 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar13 = 0;
    iVar7 = 0;
    iVar12 = 0;
    do {
      iVar11 = iVar13;
      if (psVar1 != (sel_t *)0x0) {
        iVar11 = (idx_t)psVar1[iVar13];
      }
      iVar6 = iVar13;
      if (psVar2 != (sel_t *)0x0) {
        iVar6 = (idx_t)psVar2[iVar13];
      }
      iVar10 = iVar13;
      if (psVar3 != (sel_t *)0x0) {
        iVar10 = (idx_t)psVar3[iVar13];
      }
      if ((((puVar4 == (unsigned_long *)0x0) || ((puVar4[iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0))
          && ((puVar5 == (unsigned_long *)0x0 || ((puVar5[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) != 0)
              ))) && (ldata[iVar6] == rdata[iVar10])) {
        iVar6 = iVar7 + 1;
        pSVar9 = true_sel;
        iVar10 = iVar12;
      }
      else {
        iVar10 = iVar12 + 1;
        iVar6 = iVar7;
        pSVar9 = false_sel;
        iVar7 = iVar12;
      }
      pSVar9->sel_vector[iVar7] = (sel_t)iVar11;
      iVar13 = iVar13 + 1;
      iVar7 = iVar6;
      iVar12 = iVar10;
    } while (count != iVar13);
    return iVar6;
  }
  return 0;
}

Assistant:

static inline idx_t
	SelectGenericLoopSelSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                           const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                           const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                           ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, false>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, false, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		}
	}